

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgcrypto.hpp
# Opt level: O0

int __thiscall
ws::Crypto::verify_sign
          (Crypto *this,string *msg_sign,string *time_stamp,string *nonce,string *msg_encrypt)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  args;
  __type_conflict1 _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  undefined1 local_88 [16];
  string local_78;
  undefined1 local_58 [8];
  string dev_msg_sign;
  string *msg_encrypt_local;
  string *nonce_local;
  string *time_stamp_local;
  string *msg_sign_local;
  Crypto *this_local;
  
  dev_msg_sign.field_2._8_8_ = msg_encrypt;
  std::__cxx11::string::string((string *)&local_108,&this->token);
  std::__cxx11::string::string(local_e8,time_stamp);
  std::__cxx11::string::string(local_c8,nonce);
  std::__cxx11::string::string
            (local_a8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      dev_msg_sign.field_2._8_8_);
  local_88._0_8_ = &local_108;
  local_88._8_8_ = 4;
  args._M_len = 4;
  args._M_array = (iterator)local_88._0_8_;
  wx_sort((string *)(local_88 + 0x10),args);
  wx_sha1((string *)local_58,(string *)(local_88 + 0x10));
  std::__cxx11::string::~string((string *)(local_88 + 0x10));
  local_128 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88;
  do {
    local_128 = local_128 + -1;
    std::__cxx11::string::~string((string *)local_128);
  } while (local_128 != &local_108);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,msg_sign);
  if (_Var1) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = -1;
  }
  std::__cxx11::string::~string((string *)local_58);
  return this_local._4_4_;
}

Assistant:

int verify_sign(const std::string &msg_sign, const std::string &time_stamp,
                    const std::string &nonce, const std::string &msg_encrypt)
    {
      std::string dev_msg_sign = wx_sha1(wx_sort({token, time_stamp, nonce, msg_encrypt}));
      if (dev_msg_sign == msg_sign)
      {
        return 0;
      }
      else
        return -1;
    }